

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

ssize_t uv__fs_copy_file_range
                  (int fd_in,off_t_conflict *off_in,int fd_out,off_t_conflict *off_out,size_t len,
                  uint flags)

{
  long lVar1;
  uint flags_local;
  size_t len_local;
  off_t_conflict *off_out_local;
  int fd_out_local;
  off_t_conflict *off_in_local;
  int fd_in_local;
  
  lVar1 = syscall(0x146,(ulong)(uint)fd_in,off_in,(ulong)(uint)fd_out,off_out,len,flags);
  return lVar1;
}

Assistant:

ssize_t
uv__fs_copy_file_range(int fd_in,
                       off_t* off_in,
                       int fd_out,
                       off_t* off_out,
                       size_t len,
                       unsigned int flags)
{
#ifdef __NR_copy_file_range
  return syscall(__NR_copy_file_range,
                 fd_in,
                 off_in,
                 fd_out,
                 off_out,
                 len,
                 flags);
#else
  return errno = ENOSYS, -1;
#endif
}